

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

ssize_t __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send
          (OutgoingRpcMessageImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  MallocMessageBuilder *this_00;
  uint *puVar1;
  bool bVar2;
  Iface *pIVar3;
  ForkHub<kj::_::Void> *pFVar4;
  Disposer *pDVar5;
  PromiseFulfiller<void> *pPVar6;
  Iface *pIVar7;
  TaskSet *this_01;
  PromiseArena *pPVar8;
  ArrayPtr<const_capnp::word> array;
  OwnPromiseNode OVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  word *pwVar14;
  size_t sVar15;
  int iVar16;
  undefined4 extraout_var;
  PromiseArena *pPVar18;
  WeakFulfiller<void> *params;
  void *pvVar19;
  ConnectionImpl *extraout_RAX;
  ConnectionImpl *extraout_RAX_00;
  ConnectionImpl *extraout_RAX_01;
  char *pcVar20;
  anon_union_16_1_a8c68091_for_NullableValue<kj::Function<bool_(capnp::rpc::Message::Reader)>_>_2
  *paVar21;
  SegmentBuilder *this_02;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar22;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  Promise<void> blocker;
  DebugExpression<bool> _kjCondition;
  OwnPromiseNode local_d0;
  undefined1 local_c8 [48];
  Array<capnp::word> local_98;
  Builder local_78 [3];
  ConnectionImpl *pCVar17;
  
  bVar2 = this->connection->idle;
  pcVar20 = (char *)(CONCAT71((int7)((ulong)this->connection >> 8),bVar2) & 0xffffffff ^ 1);
  local_c8[0] = (char)pcVar20;
  if ((bVar2 != false) && (kj::_::Debug::minSeverity < 3)) {
    pcVar20 = "\"failed: expected \" \"!connection.idle\", _kjCondition";
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x173,ERROR,"\"failed: expected \" \"!connection.idle\", _kjCondition",
               (char (*) [34])"failed: expected !connection.idle",(DebugExpression<bool> *)local_c8)
    ;
  }
  this_00 = &this->message;
  pIVar3 = (this->connection->vat->sendCallback).impl.ptr;
  iVar16 = (**pIVar3->_vptr_Iface)(pIVar3,this_00);
  pCVar17 = (ConnectionImpl *)CONCAT44(extraout_var,iVar16);
  if (((char)iVar16 != '\0') &&
     (pCVar17 = this->connection, (pCVar17->networkException).ptr.isSet == false)) {
    puVar1 = &pCVar17->vat->sent;
    *puVar1 = *puVar1 + 1;
    AVar22 = MessageBuilder::getSegmentsForOutput(&this_00->super_MessageBuilder);
    segments.ptr = (ArrayPtr<const_capnp::word> *)AVar22.size_;
    segments.size_ = (size_t)pcVar20;
    messageToFlatArray(&local_98,(capnp *)AVar22.ptr,segments);
    pPVar18 = (PromiseArena *)operator_new(0x130);
    sVar15 = local_98.size_;
    pwVar14 = local_98.ptr;
    array.size_ = local_98.size_;
    array.ptr = local_98.ptr;
    local_c8._16_8_ = local_98.disposer;
    local_98.ptr = (word *)0x0;
    local_98.size_ = 0;
    pPVar18->bytes[0x10] = '\0';
    pPVar18->bytes[0x11] = '\0';
    pPVar18->bytes[0x12] = '\0';
    pPVar18->bytes[0x13] = '\0';
    *(undefined ***)pPVar18->bytes = &PTR_getBody_006e4f10;
    *(undefined ***)(pPVar18->bytes + 8) = &PTR_disposeImpl_006e4f48;
    *(word **)(pPVar18->bytes + 0x18) = pwVar14;
    *(size_t *)(pPVar18->bytes + 0x20) = sVar15;
    *(ArrayDisposer **)(pPVar18->bytes + 0x28) = local_98.disposer;
    local_c8._0_8_ = (SegmentBuilder *)0x0;
    local_c8._8_8_ = (WeakFulfillerBase *)0x0;
    options._8_8_ = 0x40;
    options.traversalLimitInWords = 0x800000;
    FlatArrayMessageReader::FlatArrayMessageReader
              ((FlatArrayMessageReader *)(pPVar18->bytes + 0x30),array,options);
    uVar11 = local_c8._8_8_;
    uVar10 = local_c8._0_8_;
    if ((PromiseNode *)local_c8._0_8_ != (PromiseNode *)0x0) {
      local_c8._0_8_ = (SegmentBuilder *)0x0;
      local_c8._8_8_ = (WeakFulfillerBase *)0x0;
      (**(_func_int **)*(WirePointer *)local_c8._16_8_)(local_c8._16_8_,uVar10,8,uVar11,uVar11,0);
    }
    sVar15 = local_98.size_;
    pwVar14 = local_98.ptr;
    if ((SegmentBuilder *)local_98.ptr != (SegmentBuilder *)0x0) {
      local_98.ptr = (word *)0x0;
      local_98.size_ = 0;
      (**(_func_int **)*(WirePointer *)local_98.disposer)
                (local_98.disposer,pwVar14,8,sVar15,sVar15,0);
    }
    local_d0.ptr = (PromiseNode *)0x0;
    if ((this->connection->currentBlock).ptr.isSet == true) {
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_c8);
      OVar9.ptr = local_d0.ptr;
      local_d0.ptr = (PromiseNode *)local_c8._0_8_;
      local_c8._0_8_ = (SegmentBuilder *)0x0;
      if (&(OVar9.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(&(OVar9.ptr)->super_PromiseArenaMember);
      }
      uVar10 = local_c8._0_8_;
      if ((PromiseNode *)local_c8._0_8_ != (PromiseNode *)0x0) {
        local_c8._0_8_ = (SegmentBuilder *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar10);
      }
    }
    else {
      kj::yield();
      OVar9.ptr = local_d0.ptr;
      local_d0.ptr = (PromiseNode *)local_c8._0_8_;
      local_c8._0_8_ = (SegmentBuilder *)0x0;
      if (&(OVar9.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(&(OVar9.ptr)->super_PromiseArenaMember);
      }
      uVar10 = local_c8._0_8_;
      if ((PromiseNode *)local_c8._0_8_ != (PromiseNode *)0x0) {
        local_c8._0_8_ = (SegmentBuilder *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar10);
      }
      bVar2 = (this->connection->blockAfterPredicate).ptr.isSet;
      paVar21 = (anon_union_16_1_a8c68091_for_NullableValue<kj::Function<bool_(capnp::rpc::Message::Reader)>_>_2
                 *)0x0;
      if (bVar2 != false) {
        paVar21 = &(this->connection->blockAfterPredicate).ptr.field_1;
      }
      if (bVar2 == true) {
        MessageBuilder::getRootInternal(local_78,&this_00->super_MessageBuilder);
        local_98.disposer = (ArrayDisposer *)local_78[0].builder.pointer;
        local_98.ptr = (word *)local_78[0].builder.segment;
        local_98.size_ = (size_t)local_78[0].builder.capTable;
        PointerBuilder::getStruct
                  ((StructBuilder *)local_c8,(PointerBuilder *)&local_98,(StructSize)0x10001,
                   (word *)0x0);
        StructBuilder::asReader((StructBuilder *)local_c8);
        iVar16 = (**((paVar21->value).impl.ptr)->_vptr_Iface)();
        if ((char)iVar16 != '\0') {
          pCVar17 = this->connection;
          params = (WeakFulfiller<void> *)operator_new(0x18);
          (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
          (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
               (_func_int **)&PTR_reject_006e1308;
          (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
               (_func_int **)&PTR_disposeImpl_006e1340;
          kj::_::PromiseDisposer::
          alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
                    ((PromiseDisposer *)&local_98,params);
          local_c8._0_8_ = local_98.ptr;
          local_98.ptr = (word *)0x52ac4b;
          local_98.size_ = 0x52b0f9;
          local_98.disposer = (ArrayDisposer *)0x160000013e;
          local_c8._8_8_ = &params->super_WeakFulfillerBase;
          local_c8._16_8_ = params;
          kj::Promise<void>::fork((Promise<void> *)local_78);
          if ((pCVar17->currentBlock).ptr.isSet == true) {
            (pCVar17->currentBlock).ptr.isSet = false;
            pFVar4 = (pCVar17->currentBlock).ptr.field_1.value.hub.ptr;
            if (pFVar4 != (ForkHub<kj::_::Void> *)0x0) {
              (pCVar17->currentBlock).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
              pDVar5 = (pCVar17->currentBlock).ptr.field_1.value.hub.disposer;
              (**pDVar5->_vptr_Disposer)
                        (pDVar5,(_func_int *)
                                ((long)&(pFVar4->super_ForkHubBase).super_PromiseArenaMember.
                                        _vptr_PromiseArenaMember +
                                (long)(pFVar4->super_ForkHubBase).super_PromiseArenaMember.
                                      _vptr_PromiseArenaMember[-2]));
            }
          }
          (pCVar17->currentBlock).ptr.field_1.value.hub.disposer =
               (Disposer *)local_78[0].builder.segment;
          (pCVar17->currentBlock).ptr.field_1.value.hub.ptr =
               (ForkHub<kj::_::Void> *)local_78[0].builder.capTable;
          local_78[0].builder.capTable = (CapTableBuilder *)0x0;
          (pCVar17->currentBlock).ptr.isSet = true;
          uVar12 = local_c8._16_4_;
          uVar13 = local_c8._20_4_;
          local_c8._16_8_ = (WirePointer *)0x0;
          pDVar5 = (pCVar17->currentBlockFulfiller).ptr.disposer;
          pPVar6 = (pCVar17->currentBlockFulfiller).ptr.ptr;
          *(undefined4 *)&(pCVar17->currentBlockFulfiller).ptr.disposer = local_c8._8_4_;
          *(undefined4 *)((long)&(pCVar17->currentBlockFulfiller).ptr.disposer + 4) =
               local_c8._12_4_;
          *(undefined4 *)&(pCVar17->currentBlockFulfiller).ptr.ptr = uVar12;
          *(undefined4 *)((long)&(pCVar17->currentBlockFulfiller).ptr.ptr + 4) = uVar13;
          if (pPVar6 != (PromiseFulfiller<void> *)0x0) {
            (**pDVar5->_vptr_Disposer)
                      (pDVar5,(_func_int *)
                              ((long)&(pPVar6->super_PromiseRejector)._vptr_PromiseRejector +
                              (long)(pPVar6->super_PromiseRejector)._vptr_PromiseRejector[-2]));
          }
          uVar10 = local_c8._16_8_;
          if ((WirePointer *)local_c8._16_8_ != (WirePointer *)0x0) {
            local_c8._16_8_ = (WirePointer *)0x0;
            (**((Disposer *)local_c8._8_8_)->_vptr_Disposer)
                      (local_c8._8_8_,
                       (_func_int *)
                       ((long)&(((Maybe<kj::Exception> *)uVar10)->ptr).isSet +
                       (long)*(_func_int **)((long)*(WirePointer *)uVar10 + -0x10)));
          }
          uVar10 = local_c8._0_8_;
          if ((SegmentBuilder *)local_c8._0_8_ != (SegmentBuilder *)0x0) {
            local_c8._0_8_ = (SegmentBuilder *)0x0;
            kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar10);
          }
          pCVar17 = this->connection;
          if ((pCVar17->blockAfterPredicate).ptr.isSet == true) {
            (pCVar17->blockAfterPredicate).ptr.isSet = false;
            pIVar7 = (pCVar17->blockAfterPredicate).ptr.field_1.value.impl.ptr;
            if (pIVar7 != (Iface *)0x0) {
              (pCVar17->blockAfterPredicate).ptr.field_1.value.impl.ptr = (Iface *)0x0;
              pDVar5 = (pCVar17->blockAfterPredicate).ptr.field_1.value.impl.disposer;
              (**pDVar5->_vptr_Disposer)
                        (pDVar5,(_func_int *)
                                ((long)&pIVar7->_vptr_Iface + (long)pIVar7->_vptr_Iface[-2]));
            }
          }
        }
      }
    }
    OVar9.ptr = local_d0.ptr;
    pCVar17 = this->connection;
    this_01 = (pCVar17->tasks).ptr;
    pPVar8 = *(PromiseArena **)&((SegmentReader *)&(local_d0.ptr)->super_PromiseArenaMember)->id;
    if (pPVar8 == (PromiseArena *)0x0 || (ulong)((long)local_d0.ptr - (long)pPVar8) < 0x38) {
      pvVar19 = operator_new(0x400);
      this_02 = (SegmentBuilder *)((long)pvVar19 + 0x3c8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_02,&local_d0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:402:13)>
                 ::anon_class_24_2_d9090f80_for_func::operator());
      *(undefined ***)((long)pvVar19 + 0x3c8) = &PTR_destroy_006e4fe0;
      *(ConnectionImpl **)((long)pvVar19 + 1000) = pCVar17;
      *(undefined8 **)((long)pvVar19 + 0x3f0) =
           &kj::_::
            HeapDisposer<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl>
            ::instance;
      *(PromiseArena **)((long)pvVar19 + 0x3f8) = pPVar18;
      *(void **)((long)pvVar19 + 0x3d0) = pvVar19;
    }
    else {
      *(PromiseArena **)&((SegmentReader *)&(local_d0.ptr)->super_PromiseArenaMember)->id =
           (PromiseArena *)0x0;
      this_02 = (SegmentBuilder *)&local_d0.ptr[-4].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_02,&local_d0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:402:13)>
                 ::anon_class_24_2_d9090f80_for_func::operator());
      OVar9.ptr[-4].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006e4fe0;
      OVar9.ptr[-2].super_PromiseArenaMember.arena = (PromiseArena *)pCVar17;
      OVar9.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)
           &kj::_::
            HeapDisposer<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl>
            ::instance;
      OVar9.ptr[-1].super_PromiseArenaMember.arena = pPVar18;
      OVar9.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar8;
    }
    local_c8._0_8_ = this_02;
    kj::TaskSet::add(this_01,(Promise<void> *)local_c8);
    uVar10 = local_c8._0_8_;
    pCVar17 = extraout_RAX;
    if ((SegmentBuilder *)local_c8._0_8_ != (SegmentBuilder *)0x0) {
      local_c8._0_8_ = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar10);
      pCVar17 = extraout_RAX_00;
    }
    OVar9.ptr = local_d0.ptr;
    if ((SegmentBuilder *)local_d0.ptr != (SegmentBuilder *)0x0) {
      local_d0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar9.ptr)->super_PromiseArenaMember);
      pCVar17 = extraout_RAX_01;
    }
  }
  return (ssize_t)pCVar17;
}

Assistant:

void send() override {
        KJ_EXPECT(!connection.idle);
        if (!connection.vat.sendCallback(message)) return;

        if (connection.networkException != kj::none) {
          return;
        }

        ++connection.vat.sent;

        // Uncomment to get a debug dump.
//        connection.dumper.dump(message.getRoot<rpc::Message>());

        auto incomingMessage = kj::heap<IncomingRpcMessageImpl>(messageToFlatArray(message));

        kj::Promise<void> blocker = nullptr;
        KJ_IF_SOME(b, connection.currentBlock) {
          blocker = b.addBranch();
        } else {
          blocker = kj::yield();

          // Check if we should start blocking.
          KJ_IF_SOME(p, connection.blockAfterPredicate) {
            if (p(message.getRoot<rpc::Message>())) {
              connection.block();
              connection.blockAfterPredicate = kj::none;
            }
          }
        }